

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O3

bool CoreML::Specification::operator==(NeuralNetworkClassifier *a,NeuralNetworkClassifier *b)

{
  uint32 uVar1;
  bool bVar2;
  
  bVar2 = operator==(&a->layers_,&b->layers_);
  if (((!bVar2) || (bVar2 = operator==(&a->preprocessing_,&b->preprocessing_), !bVar2)) ||
     (uVar1 = a->_oneof_case_[0], uVar1 != b->_oneof_case_[0])) {
    return false;
  }
  if (uVar1 == 0) {
    return true;
  }
  if (uVar1 != 100) {
    bVar2 = vectorsEqual<CoreML::Specification::Int64Vector>
                      ((a->ClassLabels_).int64classlabels_,(b->ClassLabels_).int64classlabels_);
    return bVar2;
  }
  bVar2 = vectorsEqual<CoreML::Specification::StringVector>
                    ((a->ClassLabels_).stringclasslabels_,(b->ClassLabels_).stringclasslabels_);
  return bVar2;
}

Assistant:

bool operator==(const NeuralNetworkClassifier& a,
                        const NeuralNetworkClassifier& b) {
            if (a.layers() != b.layers()) {
                return false;
            }
            if (a.preprocessing() != b.preprocessing()) {
                return false;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case NeuralNetworkClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case NeuralNetworkClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case NeuralNetworkClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }